

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void __thiscall de::SpinBarrier::sync(SpinBarrier *this)

{
  deInt32 numThreads;
  WaitMode WVar1;
  deInt32 dVar2;
  WaitMode in_ESI;
  WaitMode waitMode;
  deInt32 cachedNumThreads;
  WaitMode requestedMode_local;
  SpinBarrier *this_local;
  
  numThreads = this->m_numThreads;
  WVar1 = getWaitMode(in_ESI,this->m_numCores,numThreads);
  deMemoryReadWriteFence();
  if (0 < this->m_numLeaving) {
    while (this->m_numLeaving != 0) {
      wait((void *)(ulong)WVar1);
    }
  }
  dVar2 = ::deAtomicIncrementInt32(&this->m_numEntered);
  if (dVar2 == numThreads) {
    this->m_numThreads = this->m_numThreads - this->m_numRemoved;
    this->m_numLeaving = this->m_numThreads;
    this->m_numRemoved = 0;
    deMemoryReadWriteFence();
    this->m_numEntered = 0;
  }
  else {
    while (this->m_numEntered != 0) {
      wait((void *)(ulong)WVar1);
    }
  }
  ::deAtomicDecrementInt32(&this->m_numLeaving);
  deMemoryReadWriteFence();
  return;
}

Assistant:

void SpinBarrier::sync (WaitMode requestedMode)
{
	const deInt32	cachedNumThreads	= m_numThreads;
	const WaitMode	waitMode			= getWaitMode(requestedMode, m_numCores, cachedNumThreads);

	deMemoryReadWriteFence();

	// m_numEntered must not be touched until all threads have had
	// a chance to observe it being 0.
	if (m_numLeaving > 0)
	{
		for (;;)
		{
			if (m_numLeaving == 0)
				break;

			wait(waitMode);
		}
	}

	// If m_numRemoved > 0, m_numThreads will decrease. If m_numThreads is decreased
	// just after atomicOp and before comparison, the branch could be taken by multiple
	// threads. Since m_numThreads only changes if all threads are inside the spinbarrier,
	// cached value at snapshotted at the beginning of the function will be equal for
	// all threads.
	if (deAtomicIncrement32(&m_numEntered) == cachedNumThreads)
	{
		// Release all waiting threads. Since this thread has not been removed, m_numLeaving will
		// be >= 1 until m_numLeaving is decremented at the end of this function.
		m_numThreads -= m_numRemoved;
		m_numLeaving  = m_numThreads;
		m_numRemoved  = 0;

		deMemoryReadWriteFence();
		m_numEntered  = 0;
	}
	else
	{
		for (;;)
		{
			if (m_numEntered == 0)
				break;

			wait(waitMode);
		}
	}

	deAtomicDecrement32(&m_numLeaving);
	deMemoryReadWriteFence();
}